

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3_ex.h
# Opt level: O0

int mp3dec_ex_open_buf(mp3dec_ex_t *dec,uint8_t *buf,size_t buf_size,int flags)

{
  float in_ECX;
  long in_RDX;
  long in_RSI;
  mp3dec_t *in_RDI;
  void *unaff_retaddr;
  MP3D_ITERATE_CB in_stack_00000008;
  int ret;
  bool local_29;
  int local_4;
  
  if ((((in_RDI == (mp3dec_t *)0x0) || (in_RSI == 0)) || (in_RDX == -1)) ||
     (((uint)in_ECX & 0xfffffffc) != 0)) {
    local_4 = -1;
  }
  else {
    memset(in_RDI,0,0x2cc0);
    *(long *)(in_RDI[1].mdct_overlap[0] + 1) = in_RSI;
    *(long *)(in_RDI[1].mdct_overlap[0] + 3) = in_RDX;
    in_RDI[1].qmf_state[0x264] = in_ECX;
    mp3dec_init(in_RDI);
    local_4 = mp3dec_iterate_buf((uint8_t *)buf_size,CONCAT44(flags,ret),in_stack_00000008,
                                 unaff_retaddr);
    if ((local_4 == 0) || (local_4 == -4)) {
      mp3dec_init(in_RDI);
      in_RDI[1].qmf_state[0x268] = 0.0;
      local_29 = in_RDI[1].qmf_state[0x265] != 0.0 || ((uint)in_ECX & 2) != 0;
      in_RDI[1].qmf_state[0x266] = (float)(uint)((local_29 ^ 0xffU) & 1);
      in_RDI[1].qmf_state[0x264] = (float)((uint)in_RDI[1].qmf_state[0x264] & 0xfffffffd);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int mp3dec_ex_open_buf(mp3dec_ex_t *dec, const uint8_t *buf, size_t buf_size, int flags)
{
    if (!dec || !buf || (size_t)-1 == buf_size || (flags & (~MP3D_FLAGS_MASK)))
        return MP3D_E_PARAM;
    memset(dec, 0, sizeof(*dec));
    dec->file.buffer = buf;
    dec->file.size   = buf_size;
    dec->flags       = flags;
    mp3dec_init(&dec->mp3d);
    int ret = mp3dec_iterate_buf(dec->file.buffer, dec->file.size, mp3dec_load_index, dec);
    if (ret && MP3D_E_USER != ret)
        return ret;
    mp3dec_init(&dec->mp3d);
    dec->buffer_samples = 0;
    dec->indexes_built = !(dec->vbr_tag_found || (flags & MP3D_DO_NOT_SCAN));
    dec->flags &= (~MP3D_DO_NOT_SCAN);
    return 0;
}